

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

_Bool store_is_staple(store *s,object_kind *k)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  
  if (s == (store *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x211,"_Bool store_is_staple(struct store *, struct object_kind *)");
  }
  if (k == (object_kind *)0x0) {
    __assert_fail("k",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/store.c"
                  ,0x212,"_Bool store_is_staple(struct store *, struct object_kind *)");
  }
  uVar1 = s->always_num;
  if (uVar1 == 0) {
    _Var4 = false;
  }
  else if (*s->always_table == k) {
    _Var4 = true;
  }
  else {
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (uVar1 == uVar3) break;
      uVar2 = uVar3 + 1;
    } while (s->always_table[uVar3] != k);
    _Var4 = uVar3 < uVar1;
  }
  return _Var4;
}

Assistant:

static bool store_is_staple(struct store *s, struct object_kind *k) {
	size_t i;

	assert(s);
	assert(k);

	for (i = 0; i < s->always_num; i++) {
		struct object_kind *l = s->always_table[i];
		if (k == l)
			return true;
	}

	return false;
}